

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  _Alloc_hider __nptr;
  char cVar1;
  uint uVar2;
  uint uVar3;
  uint *cell;
  path *ppVar4;
  int *piVar5;
  ulong uVar6;
  istream *piVar7;
  _Bit_type *p_Var8;
  ostream *poVar9;
  long *plVar10;
  basic_ostream<char,_std::char_traits<char>_> *pbVar11;
  undefined8 uVar12;
  path *ppVar13;
  int iVar14;
  uint uVar15;
  uint num_cells;
  uint num_nets;
  Partitionment partitionment;
  Hypergraph hypergraph;
  string cur_str;
  path input_path;
  path output_path;
  ifstream input;
  ofstream output;
  uint local_534;
  allocator_type local_52d;
  uint local_52c;
  Partitionment local_528;
  ulong local_500;
  Hypergraph local_4f8;
  undefined1 *local_4c8;
  undefined8 local_4c0;
  undefined1 local_4b8;
  undefined7 uStack_4b7;
  path local_4a8;
  istream_iterator<unsigned_int,_char,_std::char_traits<char>,_long> local_480;
  istream_iterator<unsigned_int,_char,_std::char_traits<char>,_long> local_470;
  path local_460;
  path local_438 [13];
  undefined1 local_230 [120];
  ios_base local_1b8 [128];
  ios_base local_138 [264];
  
  if (argc - 4U < 0xfffffffe) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Usage: ./partioner [path to *.hgr file] [optional max difference]",0x41);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
    return 1;
  }
  std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
            (&local_4a8,argv + 1,auto_format);
  std::filesystem::current_path_abi_cxx11_();
  if (local_4a8._M_pathname._M_string_length == 0) {
LAB_00102706:
    std::filesystem::__cxx11::path::path((path *)local_230);
  }
  else {
    ppVar4 = &local_4a8;
    if ((~local_4a8._M_cmpts & 3) != 0) {
      if (((local_4a8._32_8_ & 3) == 0) &&
         (local_4a8._M_pathname._M_dataplus._M_p[local_4a8._M_pathname._M_string_length - 1] != '/')
         ) {
        if ((local_4a8._32_8_ & 3) == 0) {
          ppVar4 = (path *)std::filesystem::__cxx11::path::_List::end();
        }
        else {
          ppVar4 = (path *)0x0;
        }
        ppVar13 = (path *)&ppVar4[-2]._M_cmpts;
        if ((local_4a8._32_8_ & 3) != 0) {
          ppVar13 = ppVar4;
        }
        ppVar4 = &local_4a8;
        if ((local_4a8._32_8_ & 3) == 0) {
          ppVar4 = ppVar13;
        }
        if ((~*(uint *)&ppVar4->_M_cmpts & 3) == 0) {
          ppVar4 = &local_4a8;
          if ((local_4a8._32_8_ & 3) == 0) {
            ppVar4 = ppVar13;
          }
          goto LAB_001026f4;
        }
      }
      goto LAB_00102706;
    }
LAB_001026f4:
    std::filesystem::__cxx11::path::path((path *)local_230,ppVar4);
  }
  std::filesystem::__cxx11::path::path<char[8],std::filesystem::__cxx11::path>
            ((path *)&local_4f8,(char (*) [8])".part.2",auto_format);
  ppVar4 = (path *)std::filesystem::__cxx11::path::replace_extension((path *)local_230);
  std::filesystem::__cxx11::operator/(&local_460,local_438,ppVar4);
  std::filesystem::__cxx11::path::~path((path *)&local_4f8);
  std::filesystem::__cxx11::path::~path((path *)local_230);
  std::filesystem::__cxx11::path::~path(local_438);
  local_500 = 1;
  if (argc != 3) goto LAB_00102824;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_438,argv[2],(allocator<char> *)&local_4f8);
  __nptr._M_p = local_438[0]._M_pathname._M_dataplus._M_p;
  piVar5 = __errno_location();
  iVar14 = *piVar5;
  *piVar5 = 0;
  uVar6 = strtoul(__nptr._M_p,(char **)local_230,10);
  if ((pointer)local_230._0_8_ == __nptr._M_p) {
    uVar12 = std::__throw_invalid_argument("stoul");
    std::filesystem::__cxx11::path::~path(local_438);
    std::filesystem::__cxx11::path::~path(&local_4a8);
    _Unwind_Resume(uVar12);
  }
  if (*piVar5 == 0) {
LAB_001027f4:
    *piVar5 = iVar14;
  }
  else if (*piVar5 == 0x22) {
    std::__throw_out_of_range("stoul");
    goto LAB_001027f4;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438[0]._M_pathname._M_dataplus._M_p != &local_438[0]._M_pathname.field_2) {
    operator_delete(local_438[0]._M_pathname._M_dataplus._M_p,
                    local_438[0]._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_500 = (ulong)((int)uVar6 + (uint)((int)uVar6 == 0));
LAB_00102824:
  std::ifstream::ifstream(local_438,local_4a8._M_pathname._M_dataplus._M_p,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Can not open ",0xd);
    pbVar11 = std::filesystem::__cxx11::operator<<
                        ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_4a8);
    std::ios::widen((char)*(undefined8 *)(*(long *)pbVar11 + -0x18) + (char)pbVar11);
    std::ostream::put((char)pbVar11);
    iVar14 = 1;
    std::ostream::flush();
  }
  else {
    piVar7 = std::istream::_M_extract<unsigned_int>((uint *)local_438);
    std::istream::_M_extract<unsigned_int>((uint *)piVar7);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::vector(&local_4f8.cells_,(ulong)local_534,(allocator_type *)local_230);
    local_4f8.nets_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4f8.nets_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4f8.nets_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_4c8 = &local_4b8;
    local_4c0 = 0;
    local_4b8 = 0;
    cVar1 = std::ios::widen((char)local_438 +
                            (char)*(undefined8 *)(local_438[0]._M_pathname._M_dataplus._M_p + -0x18)
                           );
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_438,(string *)&local_4c8,cVar1);
    if (local_52c != 0) {
      uVar15 = 0;
      do {
        cVar1 = std::ios::widen((char)*(undefined8 *)
                                       (local_438[0]._M_pathname._M_dataplus._M_p + -0x18) +
                                (char)local_438);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_438,(string *)&local_4c8,cVar1);
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_230,(string *)&local_4c8,_S_in);
        local_470._M_ok = true;
        local_470._M_stream = (istream_type *)local_230;
        std::istream_iterator<unsigned_int,_char,_std::char_traits<char>,_long>::_M_read(&local_470)
        ;
        local_480._M_stream = (istream_type *)0x0;
        local_480._M_value = 0;
        local_480._M_ok = false;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        vector<std::istream_iterator<unsigned_int,char,std::char_traits<char>,long>,void>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_528,&local_470,
                   &local_480,&local_52d);
        for (p_Var8 = local_528.partitionment_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            p_Var8 != (_Bit_type *)
                      CONCAT44(local_528.partitionment_.super__Bvector_base<std::allocator<bool>_>.
                               _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                               _12_4_,local_528.partitionment_.
                                      super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                      _M_offset); p_Var8 = (_Bit_type *)((long)p_Var8 + 4)) {
          *(int *)p_Var8 = (int)*p_Var8 + -1;
        }
        Hypergraph::addNet(&local_4f8,(Net *)&local_528);
        if (local_528.partitionment_.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
          operator_delete(local_528.partitionment_.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                          (long)local_528.partitionment_.super__Bvector_base<std::allocator<bool>_>.
                                _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                _M_p -
                          (long)local_528.partitionment_.super__Bvector_base<std::allocator<bool>_>.
                                _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                _M_p);
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)local_230);
        std::ios_base::~ios_base(local_1b8);
        uVar15 = uVar15 + 1;
      } while (uVar15 < local_52c);
    }
    std::ifstream::close();
    Partitionment::Partitionment(&local_528,local_534);
    uVar15 = Partitionment::getPartitionCost(&local_528,&local_4f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Initial cut cost: ",0x12);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    do {
      uVar2 = FM_pass(&local_4f8,&local_528,(uint)local_500);
      if (uVar2 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Cut cost after pass #",0x15);
        *(undefined8 *)(std::ofstream::close + *(long *)(std::cout + -0x18)) = 2;
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
        uVar15 = uVar15 - uVar2;
        *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 5;
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        uVar3 = Partitionment::getPartitionCost(&local_528,&local_4f8);
        if (uVar15 != uVar3) {
          __assert_fail("cost == partitionment.getPartitionCost(hypergraph)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kachkov98[P]hypergraph-partitioning/main.cpp"
                        ,0x33,"int main(int, char **)");
        }
      }
    } while (uVar2 != 0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Final cut cost: ",0x10);
    Partitionment::getPartitionCost(&local_528,&local_4f8);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::ofstream::ofstream(local_230,local_460._M_pathname._M_dataplus._M_p,_S_out);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Can not open ",0xd);
      pbVar11 = std::filesystem::__cxx11::operator<<
                          ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_460);
      std::ios::widen((char)*(undefined8 *)(*(long *)pbVar11 + -0x18) + (char)pbVar11);
      std::ostream::put((char)pbVar11);
      iVar14 = 1;
      std::ostream::flush();
    }
    else {
      if (local_534 != 0) {
        uVar6 = 0;
        do {
          plVar10 = (long *)std::ostream::operator<<
                                      ((ostream *)local_230,
                                       (uint)((local_528.partitionment_.
                                               super__Bvector_base<std::allocator<bool>_>._M_impl.
                                               super__Bvector_impl_data._M_start.
                                               super__Bit_iterator_base._M_p[uVar6 >> 6] >>
                                               (uVar6 & 0x3f) & 1) != 0));
          std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
          std::ostream::put((char)plVar10);
          std::ostream::flush();
          uVar6 = uVar6 + 1;
        } while (uVar6 < local_534);
      }
      iVar14 = 0;
      std::ofstream::close();
    }
    local_230._0_8_ = _VTT;
    *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = _memcpy;
    std::filebuf::~filebuf((filebuf *)(local_230 + 8));
    std::ios_base::~ios_base(local_138);
    if (local_528.partitionment_.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_528.partitionment_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_528.partitionment_.super__Bvector_base<std::allocator<bool>_>.
                            _M_impl.super__Bvector_impl_data._M_end_of_storage -
                      (long)local_528.partitionment_.super__Bvector_base<std::allocator<bool>_>.
                            _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)
      ;
      local_528.partitionment_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_528.partitionment_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      local_528.partitionment_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_528.partitionment_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      local_528.partitionment_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_4c8 != &local_4b8) {
      operator_delete(local_4c8,CONCAT71(uStack_4b7,local_4b8) + 1);
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector(&local_4f8.nets_);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector(&local_4f8.cells_);
  }
  std::ifstream::~ifstream(local_438);
  std::filesystem::__cxx11::path::~path(&local_460);
  std::filesystem::__cxx11::path::~path(&local_4a8);
  return iVar14;
}

Assistant:

int main(int argc, char *argv[]) {
  if (argc != 2 && argc != 3) {
    std::cout << "Usage: ./partioner [path to *.hgr file] [optional max difference]" << std::endl;
    return 1;
  }
  std::filesystem::path input_path = argv[1],
                        output_path = std::filesystem::current_path() /
                                      input_path.filename().replace_extension(".part.2");
  unsigned max_diff = 1;
  if (argc == 3)
    if (unsigned n = std::stoul(argv[2]))
      max_diff = n;
  // Load hypergraph
  std::ifstream input(input_path.c_str());
  if (!input.is_open()) {
    std::cout << "Can not open " << input_path << std::endl;
    return 1;
  }
  unsigned num_nets, num_cells;
  input >> num_nets >> num_cells;
  Hypergraph hypergraph(num_cells);
  std::string cur_str;
  std::getline(input, cur_str);
  for (unsigned i = 0; i < num_nets; ++i) {
    std::getline(input, cur_str);
    std::istringstream cur_str_buf(cur_str);
    Net cur_net{std::istream_iterator<unsigned>(cur_str_buf), std::istream_iterator<unsigned>()};
    for (unsigned &cell : cur_net)
      --cell;
    hypergraph.addNet(cur_net);
  }
  input.close();
  // Do partioning
  Partitionment partitionment(num_cells);
  unsigned cost = partitionment.getPartitionCost(hypergraph), pass_num = 0;
  std::cout << "Initial cut cost: " << cost << std::endl;
  while (auto cost_reduction = FM_pass(hypergraph, partitionment, max_diff)) {
    cost -= cost_reduction;
    ++pass_num;
    std::cout << "Cut cost after pass #" << std::setw(2) << pass_num << ": " << std::setw(5) << cost
              << std::endl;
    assert(cost == partitionment.getPartitionCost(hypergraph));
  }
  std::cout << "Final cut cost: " << partitionment.getPartitionCost(hypergraph) << std::endl;
  // Save results
  std::ofstream output(output_path.c_str());
  if (!output.is_open()) {
    std::cout << "Can not open " << output_path << std::endl;
    return 1;
  }
  for (unsigned i = 0; i < num_cells; ++i)
    output << +partitionment[i] << std::endl;
  output.close();
  return 0;
}